

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

void NetworkDataType::deserializedata<GlobalStimulationSettings::CurrentScaling>
               (binarydata *data,CurrentScaling *args)

{
  Options local_299;
  PortableBinaryInputArchive archive;
  stringstream stream;
  
  std::__cxx11::string::string((string *)&archive,(string *)data);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&archive,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&archive);
  local_299.itsInputEndianness = cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (&archive,(istream *)&stream,&local_299);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::PortableBinaryInputArchive,1u> *)&archive,args);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,_1U>::~InputArchive
            (&archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }